

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.cc
# Opt level: O1

ssize_t __thiscall lrit::File::read(File *this,int __fd,void *__buf,size_t __nbytes)

{
  long *in_RAX;
  pointer *__ptr;
  undefined4 in_register_00000034;
  unique_ptr<std::basic_istream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_istream<char,_std::char_traits<char>_>_>_>
  ifs;
  _Alloc_hider local_18;
  
  (this->file_)._M_dataplus._M_p = (pointer)0x0;
  (this->file_)._M_string_length = 0;
  (this->file_).field_2._M_allocated_capacity = 0;
  local_18._M_p = (pointer)in_RAX;
  getData((File *)&stack0xffffffffffffffe8);
  std::vector<char,_std::allocator<char>_>::resize
            ((vector<char,_std::allocator<char>_> *)this,
             *(long *)(CONCAT44(in_register_00000034,__fd) + 0x90) * 0x20000000 + 0xe0000000 >> 0x20
            );
  std::istream::read(local_18._M_p,(long)(this->file_)._M_dataplus._M_p);
  (**(code **)(*(long *)local_18._M_p + 8))(local_18._M_p);
  return (ssize_t)this;
}

Assistant:

std::vector<char> File::read() const {
  std::vector<char> out;

  auto ifs = getData();
  auto bytes = (int) ((ph_.dataLength + 7) / 8);
  out.resize(bytes);
  ifs->read(out.data(), out.size());
  return out;
}